

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O0

bool __thiscall Clasp::ClaspFacade::interrupt(ClaspFacade *this,int signal)

{
  SolveData *pSVar1;
  int in_ESI;
  SafeIntType *in_stack_ffffffffffffffc0;
  int iVar2;
  SolveData *in_stack_ffffffffffffffc8;
  bool local_25;
  
  pSVar1 = SingleOwnerPtr<Clasp::ClaspFacade::SolveData,_Clasp::DeleteObject>::get
                     ((SingleOwnerPtr<Clasp::ClaspFacade::SolveData,_Clasp::DeleteObject> *)0x121923
                     );
  local_25 = false;
  if (pSVar1 != (SolveData *)0x0) {
    if (in_ESI == 0) {
      pSVar1 = SingleOwnerPtr<Clasp::ClaspFacade::SolveData,_Clasp::DeleteObject>::operator->
                         ((SingleOwnerPtr<Clasp::ClaspFacade::SolveData,_Clasp::DeleteObject> *)
                          0x121952);
      in_stack_ffffffffffffffc0 = &pSVar1->qSig;
      in_stack_ffffffffffffffc8 = (SolveData *)0x4;
      LOCK();
      iVar2 = (in_stack_ffffffffffffffc0->super___atomic_base<int>)._M_i;
      (in_stack_ffffffffffffffc0->super___atomic_base<int>)._M_i = 0;
      UNLOCK();
      if (iVar2 == 0) {
        return false;
      }
    }
    iVar2 = (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
    SingleOwnerPtr<Clasp::ClaspFacade::SolveData,_Clasp::DeleteObject>::operator->
              ((SingleOwnerPtr<Clasp::ClaspFacade::SolveData,_Clasp::DeleteObject> *)0x121a1b);
    local_25 = SolveData::interrupt(in_stack_ffffffffffffffc8,iVar2);
  }
  return local_25;
}

Assistant:

bool ClaspFacade::interrupt(int signal) {
	return solve_.get() && (signal || (signal = solve_->qSig.exchange(0)) != 0) && solve_->interrupt(signal);
}